

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmCommonTargetGenerator::cmCommonTargetGenerator
          (cmCommonTargetGenerator *this,cmGeneratorTarget *gt)

{
  _Rb_tree_header *p_Var1;
  cmLocalCommonGenerator *pcVar2;
  pointer pcVar3;
  
  this->_vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmCommonTargetGenerator_006a0600;
  this->GeneratorTarget = gt;
  this->Makefile = gt->Makefile;
  pcVar2 = (cmLocalCommonGenerator *)gt->LocalGenerator;
  this->LocalCommonGenerator = pcVar2;
  this->GlobalCommonGenerator =
       (cmGlobalCommonGenerator *)(pcVar2->super_cmLocalGenerator).GlobalGenerator;
  (this->ConfigName)._M_dataplus._M_p = (pointer)&(this->ConfigName).field_2;
  pcVar3 = (pcVar2->ConfigName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ConfigName,pcVar3,pcVar3 + (pcVar2->ConfigName)._M_string_length);
  p_Var1 = &(this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->IncludesByLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->IncludesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->IncludesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->IncludesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->IncludesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->IncludesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

cmCommonTargetGenerator::cmCommonTargetGenerator(cmGeneratorTarget* gt)
  : GeneratorTarget(gt)
  , Makefile(gt->Makefile)
  , LocalCommonGenerator(
      static_cast<cmLocalCommonGenerator*>(gt->LocalGenerator))
  , GlobalCommonGenerator(static_cast<cmGlobalCommonGenerator*>(
      gt->LocalGenerator->GetGlobalGenerator()))
  , ConfigName(LocalCommonGenerator->GetConfigName())
{
}